

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O0

size_t __thiscall
wasm::LEB<unsigned_int,_unsigned_char>::writeAt
          (LEB<unsigned_int,_unsigned_char> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *out,size_t at,size_t minimum)

{
  bool bVar1;
  byte *pbVar2;
  bool bVar3;
  bool local_49;
  byte local_3a;
  uint8_t byte;
  size_t sStack_38;
  bool more;
  size_t offset;
  uint temp;
  size_t minimum_local;
  size_t at_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  LEB<unsigned_int,_unsigned_char> *this_local;
  
  offset._4_4_ = this->value;
  sStack_38 = 0;
  do {
    local_3a = (byte)offset._4_4_ & 0x7f;
    offset._4_4_ = offset._4_4_ >> 7;
    bVar1 = hasMore(this,offset._4_4_,local_3a);
    bVar3 = sStack_38 + 1 < minimum;
    local_49 = bVar1 || bVar3;
    if (bVar1 || bVar3) {
      local_3a = local_3a | 0x80;
    }
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (out,at + sStack_38);
    *pbVar2 = local_3a;
    sStack_38 = sStack_38 + 1;
  } while (local_49);
  return sStack_38;
}

Assistant:

size_t writeAt(std::vector<uint8_t>* out, size_t at, size_t minimum = 0) {
    T temp = value;
    size_t offset = 0;
    bool more;
    do {
      uint8_t byte = temp & 127;
      temp >>= 7;
      more = hasMore(temp, byte) || offset + 1 < minimum;
      if (more) {
        byte = byte | 128;
      }
      (*out)[at + offset] = byte;
      offset++;
    } while (more);
    return offset;
  }